

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O3

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::append_data
          (section_impl<ELFIO::Elf64_Shdr> *this,char *raw_data,Elf_Word size)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__dest;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong __n;
  
  iVar3 = (*(this->super_section)._vptr_section[5])();
  if (iVar3 == 8) {
    return;
  }
  iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
  __n = (ulong)size;
  if (CONCAT44(extraout_var,iVar3) + __n < (ulong)this->data_size) {
    pcVar1 = this->data;
    iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
    if (size == 0) {
      size = 0;
    }
    else {
      memmove(pcVar1 + CONCAT44(extraout_var_00,iVar3),raw_data,__n);
    }
  }
  else {
    uVar2 = (this->data_size + size) * 2;
    this->data_size = uVar2;
    __dest = (char *)operator_new__((ulong)uVar2);
    pcVar1 = this->data;
    iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
    if (CONCAT44(extraout_var_01,iVar3) != 0) {
      memmove(__dest,pcVar1,CONCAT44(extraout_var_01,iVar3));
    }
    iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
    if (size != 0) {
      memcpy(__dest + CONCAT44(extraout_var_02,iVar3),raw_data,__n);
    }
    if (this->data != (char *)0x0) {
      operator_delete__(this->data);
    }
    this->data = __dest;
  }
  iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
  (*(this->super_section)._vptr_section[0x14])(this,(ulong)size + CONCAT44(extraout_var_03,iVar3));
  return;
}

Assistant:

void
    append_data( const char* raw_data, Elf_Word size )
    {
        if ( get_type() != SHT_NOBITS ) {
            if ( get_size() + size < data_size ) {
                std::copy( raw_data, raw_data + size, data + get_size() );
            }
            else {
                data_size = 2*( data_size + size);
                char* new_data;
                try {
                    new_data = new char[data_size];
                } catch (const std::bad_alloc&) {
                    new_data = 0;
                    size     = 0;
                }
                if ( 0 != new_data ) {
                    std::copy( data, data + get_size(), new_data );
                    std::copy( raw_data, raw_data + size, new_data + get_size() );
                    delete [] data;
                    data = new_data;
                }
            }
            set_size( get_size() + size );
        }
    }